

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membuffer.c
# Opt level: O0

int memptr_cmp_nocase(memptr *m,char *s)

{
  ulong uVar1;
  size_t sVar2;
  int cmp;
  char *s_local;
  memptr *m_local;
  
  m_local._4_4_ = strncasecmp(m->buf,s,m->length);
  if ((m_local._4_4_ == 0) && (uVar1 = m->length, sVar2 = strlen(s), uVar1 < sVar2)) {
    m_local._4_4_ = -1;
  }
  return m_local._4_4_;
}

Assistant:

int memptr_cmp_nocase(memptr *m, const char *s)
{
	int cmp;

	cmp = strncasecmp(m->buf, s, m->length);
	if (cmp == 0 && m->length < strlen(s)) {
		/* both strings equal for 'm->length' chars */
		/*  if m is shorter than s, then s is greater */
		return -1;
	}

	return cmp;
}